

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.hpp
# Opt level: O3

ConsumeResult * __thiscall
binlog::Session::consume<TestStream>
          (ConsumeResult *__return_storage_ptr__,Session *this,TestStream *out)

{
  pointer pcVar1;
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *entry;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var3;
  void *pvVar4;
  int iVar5;
  size_t sVar6;
  __normal_iterator<std::shared_ptr<binlog::Session::Channel>_*,_std::vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>_>
  __first;
  undefined8 uVar7;
  size_t in_RCX;
  pointer __n_00;
  pointer psVar8;
  pointer __buf;
  void *pvVar9;
  void *__buf_00;
  int __fd;
  shared_ptr<binlog::Session::Channel> *channelptr;
  pointer psVar10;
  void *pvVar11;
  pointer pcVar12;
  uint64_t uVar13;
  bool bVar14;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar5 != 0) {
    uVar7 = std::__throw_system_error(iVar5);
    pthread_mutex_unlock((pthread_mutex_t *)this);
    _Unwind_Resume(uVar7);
  }
  __return_storage_ptr__->channelsPolled = 0;
  __return_storage_ptr__->channelsRemoved = 0;
  __return_storage_ptr__->bytesConsumed = 0;
  __return_storage_ptr__->totalBytesConsumed = 0;
  if (this->_consumeClockSync == true) {
    pcVar12 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
    TestStream::write(out,(int)pcVar12 + 0x18,
                      (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_finish + (-0x18 - (long)pcVar12),in_RCX);
    pcVar12 = (this->_clockSync)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_finish +
              (-0x18 - (long)(this->_clockSync)._vector.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start);
    __return_storage_ptr__->bytesConsumed = (size_t)pcVar12;
    this->_consumeClockSync = false;
  }
  else {
    pcVar12 = (pointer)0x0;
  }
  pcVar1 = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = this->_sourcesConsumePos;
  __buf = (this->_sources)._vector.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_finish + (-(long)pcVar1 - __n) + -0x18;
  TestStream::write(out,(int)__n + (int)pcVar1 + 0x18,__buf,__n);
  this->_sourcesConsumePos = (streamsize)(__buf + this->_sourcesConsumePos);
  __return_storage_ptr__->bytesConsumed = (size_t)(pcVar12 + (long)__buf);
  psVar10 = (this->_channels).
            super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar8 = (this->_channels).
           super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar10 != psVar8) {
    do {
      p_Var2 = (psVar10->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar14 = false;
      }
      else {
        bVar14 = p_Var2->_M_use_count == 1;
      }
      entry = (psVar10->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
      _Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (entry->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>;
      pvVar4 = *(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
      pvVar11 = *(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30);
      if (pvVar4 < pvVar11) {
        __fd = (int)*(undefined8 *)
                     ((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
        pvVar9 = (void *)((long)*(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>.
                                                 _M_head_impl + 0x18) - (long)pvVar11);
        __buf_00 = pvVar4;
        iVar5 = __fd;
        if (*(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) <
            pvVar11 || pvVar9 == (void *)0x0) goto LAB_00186324;
        iVar5 = (int)pvVar11 + __fd;
        __buf_00 = pvVar9;
        pvVar11 = pvVar4;
      }
      else {
        __buf_00 = (void *)((long)pvVar4 - (long)pvVar11);
        iVar5 = (int)pvVar11 +
                (int)*(undefined8 *)
                      ((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
LAB_00186324:
        pvVar11 = (void *)0x0;
        __fd = 0;
      }
      uVar13 = (long)pvVar11 + (long)__buf_00;
      if (uVar13 != 0) {
        (entry->writerProp).batchSize = uVar13;
        __n_00 = psVar8;
        sVar6 = consumeSpecialEntry<binlog::WriterProp,TestStream>(this,&entry->writerProp,out);
        sVar6 = sVar6 + __return_storage_ptr__->bytesConsumed;
        __return_storage_ptr__->bytesConsumed = sVar6;
        TestStream::write(out,iVar5,__buf_00,(size_t)__n_00);
        if (pvVar11 != (void *)0x0) {
          TestStream::write(out,__fd,pvVar11,(size_t)__n_00);
        }
        *(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30) = pvVar4;
        __return_storage_ptr__->bytesConsumed = sVar6 + uVar13;
      }
      if (bVar14) {
        p_Var2 = (psVar10->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_refcount._M_pi;
        (psVar10->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (psVar10->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
        __return_storage_ptr__->channelsRemoved = __return_storage_ptr__->channelsRemoved + 1;
      }
      __return_storage_ptr__->channelsPolled = __return_storage_ptr__->channelsPolled + 1;
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar8);
    psVar10 = (this->_channels).
              super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar8 = (this->_channels).
             super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<std::shared_ptr<binlog::Session::Channel>*,std::vector<std::shared_ptr<binlog::Session::Channel>,std::allocator<std::shared_ptr<binlog::Session::Channel>>>>,__gnu_cxx::__ops::_Iter_pred<binlog::Session::consume<TestStream>(TestStream&)::_lambda(std::shared_ptr<binlog::Session::Channel>const&)_1_>>
                      (psVar10,psVar8);
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::_M_erase(&this->_channels,(iterator)__first._M_current,
             (this->_channels).
             super__Vector_base<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  sVar6 = this->_totalConsumedBytes + __return_storage_ptr__->bytesConsumed;
  this->_totalConsumedBytes = sVar6;
  __return_storage_ptr__->totalBytesConsumed = sVar6;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

Session::ConsumeResult Session::consume(OutputStream& out)
{
  // This lock:
  //  - Ensures only a single consumer is running at a time
  //  - Ensures safe read of _channels
  //  - Ensures safe read of Channel::writerProp (written by setChannelWriterName)
  //  - Ensures safe read of _sources
  //  - Ensures no new EventSource can be added to _sources while consuming
  //
  // Without this lock, the following becomes possible:
  //  - Consumer starts, consumes _sources
  //  - Producer1 adds a new elem (ES123) to sources
  //  - Producer2 finds that ES123 is already added
  //  - Producer2 adds a new event using ES123
  //  - Consumer continues, consumes the event added by Producer2
  // This would result in a corrupt stream, as the event source
  // must precede every event referencing it. This is solved by the lock
  // that blocks P1 *and* P2 while adding ES123.
  std::lock_guard<std::mutex> lock(_mutex);

  ConsumeResult result;

  // add a clock sync if not yet added
  if (_consumeClockSync)
  {
    out.write(_clockSync.data(), _clockSync.ssize());
    result.bytesConsumed += std::size_t(_clockSync.ssize());
    _consumeClockSync = false;
  }

  // consume event sources before events
  const std::streamsize sourceWriteSize = _sources.ssize() - _sourcesConsumePos;
  out.write(_sources.data() + _sourcesConsumePos, sourceWriteSize);
  _sourcesConsumePos += sourceWriteSize;
  result.bytesConsumed += std::size_t(sourceWriteSize);

  // consume some events
  for (std::shared_ptr<Channel>& channelptr : _channels)
  {
    // Important to check if channel is closed before beginRead,
    // otherwise the following race becomes possible:
    //  - Consumer finds queue is empty
    //  - Producer adds data
    //  - Producer closes the queue
    //  - Consumer finds queue is closed, removes it -> data loss
    const bool isClosed = (channelptr.use_count() == 1);

    Channel& ch = *channelptr;

    detail::QueueReader reader(ch.queue());
    const detail::QueueReader::ReadResult data = reader.beginRead();
    if (data.size())
    {
      // consume writerProp entry
      ch.writerProp.batchSize = data.size();
      result.bytesConsumed += consumeSpecialEntry(ch.writerProp, out);

      // consume queue data
      out.write(data.buffer1, std::streamsize(data.size1));
      if (data.size2)
      {
        // data wraps around the end of the queue, consume the second half as well
        out.write(data.buffer2, std::streamsize(data.size2));
      }

      reader.endRead();
      result.bytesConsumed += data.size();
    }

    if (isClosed)
    {
      // queue is empty and closed, remove it
      channelptr.reset();
      result.channelsRemoved++;
    }

    result.channelsPolled++;
  }

  // remove empty and closed channels
  _channels.erase(
    std::remove_if(
      _channels.begin(), _channels.end(),
      [](const std::shared_ptr<Channel>& channelptr) { return !channelptr; }
    ),
    _channels.end()
  );

  _totalConsumedBytes += result.bytesConsumed;
  result.totalBytesConsumed = _totalConsumedBytes;

  return result;
}